

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_setup_build_prediction_by_above_pred
               (MACROBLOCKD *xd,int rel_mi_col,uint8_t above_mi_width,MB_MODE_INFO *above_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t **ppuVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  uint8_t *puVar9;
  AV1_COMMON *pAVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  ulong uVar14;
  int mi_col;
  long lVar15;
  int x;
  uint uVar16;
  RefCntBuffer *pRVar17;
  int *piVar18;
  ulong uVar19;
  scale_factors *sf;
  
  BVar1 = above_mbmi->bsize;
  mi_col = xd->mi_col + rel_mi_col;
  above_mbmi->ref_frame[1] = -1;
  (above_mbmi->interinter_comp).type = '\0';
  if (num_planes < 1) {
    bVar11 = false;
  }
  else {
    uVar14 = 3;
    if (BLOCK_8X8 < BVar1) {
      uVar14 = (ulong)BVar1;
    }
    ppuVar5 = ctxt->tmp_buf;
    piVar6 = ctxt->tmp_width;
    piVar7 = ctxt->tmp_height;
    piVar8 = ctxt->tmp_stride;
    piVar18 = &xd->plane[0].dst.stride;
    uVar19 = 0;
    do {
      puVar9 = ppuVar5[uVar19];
      uVar16 = (uint)((0x10003UL >> (uVar14 & 0x3f) & 1) != 0);
      if (piVar18[-9] == 0) {
        uVar16 = 0;
      }
      iVar2 = piVar6[uVar19];
      iVar3 = piVar7[uVar19];
      iVar4 = piVar8[uVar19];
      ((buf_2d *)(piVar18 + -6))->buf =
           puVar9 + ((int)((~uVar16 & rel_mi_col) << 2) >> ((byte)piVar18[-9] & 0x1f));
      *(uint8_t **)(piVar18 + -4) = puVar9;
      piVar18[-2] = iVar2;
      piVar18[-1] = iVar3;
      *piVar18 = iVar4;
      uVar19 = uVar19 + 1;
      piVar18 = piVar18 + 0x28c;
    } while ((uint)num_planes != uVar19);
    bVar11 = '\0' < above_mbmi->ref_frame[1];
  }
  bVar13 = 1;
  lVar15 = 0;
  do {
    if ((byte)(above_mbmi->ref_frame[lVar15] - 1U) < 8) {
      pAVar10 = ctxt->cm;
      iVar2 = pAVar10->remapped_ref_idx[(byte)above_mbmi->ref_frame[lVar15] - 1];
      if (iVar2 == -1) {
        pRVar17 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar17 = pAVar10->ref_frame_map[iVar2];
      }
      sf = (scale_factors *)0x0;
      if (iVar2 != -1) {
        sf = pAVar10->ref_scale_factors + iVar2;
      }
    }
    else {
      pRVar17 = (RefCntBuffer *)0x0;
      sf = (scale_factors *)0x0;
    }
    xd->block_ref_scale_factors[lVar15] = sf;
    if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
      aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    }
    av1_setup_pre_planes(xd,(int)lVar15,&pRVar17->buf,xd->mi_row,mi_col,sf,num_planes);
    lVar15 = 1;
    bVar12 = (bool)(bVar13 & bVar11);
    bVar13 = 0;
  } while (bVar12);
  xd->mb_to_left_edge = mi_col * -0x20;
  xd->mb_to_right_edge =
       ((uint)xd->width - ((uint)above_mi_width + rel_mi_col)) * 0x20 + ctxt->mb_to_far_edge;
  return;
}

Assistant:

void av1_setup_build_prediction_by_above_pred(
    MACROBLOCKD *xd, int rel_mi_col, uint8_t above_mi_width,
    MB_MODE_INFO *above_mbmi, struct build_prediction_ctxt *ctxt,
    const int num_planes) {
  const BLOCK_SIZE a_bsize = AOMMAX(BLOCK_8X8, above_mbmi->bsize);
  const int above_mi_col = xd->mi_col + rel_mi_col;

  modify_neighbor_predictor_for_obmc(above_mbmi);

  for (int j = 0; j < num_planes; ++j) {
    struct macroblockd_plane *const pd = &xd->plane[j];
    setup_pred_plane(&pd->dst, a_bsize, ctxt->tmp_buf[j], ctxt->tmp_width[j],
                     ctxt->tmp_height[j], ctxt->tmp_stride[j], 0, rel_mi_col,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const int num_refs = 1 + has_second_ref(above_mbmi);

  for (int ref = 0; ref < num_refs; ++ref) {
    const MV_REFERENCE_FRAME frame = above_mbmi->ref_frame[ref];

    const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
    const struct scale_factors *const sf =
        get_ref_scale_factors_const(ctxt->cm, frame);
    xd->block_ref_scale_factors[ref] = sf;
    if ((!av1_is_valid_scale(sf)))
      aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    av1_setup_pre_planes(xd, ref, &ref_buf->buf, xd->mi_row, above_mi_col, sf,
                         num_planes);
  }

  xd->mb_to_left_edge = 8 * MI_SIZE * (-above_mi_col);
  xd->mb_to_right_edge =
      ctxt->mb_to_far_edge +
      (xd->width - rel_mi_col - above_mi_width) * MI_SIZE * 8;
}